

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_vector_of_tags.hpp
# Opt level: O1

void __thiscall
cfgfile::tag_vector_of_tags_t<cfgfile::generator::cfg::tag_namespace_t,_cfgfile::string_trait_t>::
on_finish(tag_vector_of_tags_t<cfgfile::generator::cfg::tag_namespace_t,_cfgfile::string_trait_t>
          *this,parser_info_t<cfgfile::string_trait_t> *info)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  (*(((this->m_current).
      super___shared_ptr<cfgfile::generator::cfg::tag_namespace_t,_(__gnu_cxx::_Lock_policy)2>.
     _M_ptr)->
    super_tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
    ).super_tag_t<cfgfile::string_trait_t>._vptr_tag_t[5])();
  std::
  vector<std::shared_ptr<cfgfile::generator::cfg::tag_namespace_t>,_std::allocator<std::shared_ptr<cfgfile::generator::cfg::tag_namespace_t>_>_>
  ::push_back(&this->m_tags,&this->m_current);
  this_00 = (this->m_current).
            super___shared_ptr<cfgfile::generator::cfg::tag_namespace_t,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  (this->m_current).
  super___shared_ptr<cfgfile::generator::cfg::tag_namespace_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_current).
  super___shared_ptr<cfgfile::generator::cfg::tag_namespace_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  (this->super_tag_t<cfgfile::string_trait_t>).m_is_defined = true;
  return;
}

Assistant:

void on_finish( const parser_info_t< Trait > & info ) override
	{
		m_current->on_finish( info );
		m_tags.push_back( m_current );
		m_current.reset();

		this->set_defined();
	}